

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyformat.h
# Opt level: O2

void tinyformat::
     format<int,double,double,double,double,double,float,double,double,double,double,double,double,float,double,double,double,double>
               (ostream *out,char *fmt,int *args,double *args_1,double *args_2,double *args_3,
               double *args_4,double *args_5,float *args_6,double *args_7,double *args_8,
               double *args_9,double *args_10,double *args_11,double *args_12,float *args_13,
               double *args_14,double *args_15,double *args_16,double *args_17)

{
  long in_FS_OFFSET;
  FormatList local_1c8;
  FormatArg local_1b8;
  double *local_1a0;
  code *local_198;
  code *local_190;
  double *local_188;
  code *local_180;
  code *local_178;
  double *local_170;
  code *local_168;
  code *local_160;
  double *local_158;
  code *local_150;
  code *local_148;
  double *local_140;
  code *local_138;
  code *local_130;
  float *local_128;
  code *local_120;
  code *local_118;
  double *local_110;
  code *local_108;
  code *local_100;
  double *local_f8;
  code *local_f0;
  code *local_e8;
  double *local_e0;
  code *local_d8;
  code *local_d0;
  double *local_c8;
  code *local_c0;
  code *local_b8;
  double *local_b0;
  code *local_a8;
  code *local_a0;
  double *local_98;
  code *local_90;
  code *local_88;
  float *local_80;
  code *local_78;
  code *local_70;
  double *local_68;
  code *local_60;
  code *local_58;
  double *local_50;
  code *local_48;
  code *local_40;
  double *local_38;
  code *local_30;
  code *local_28;
  double *local_20;
  code *local_18;
  code *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_1c8.m_args = &local_1b8;
  local_1c8.m_N = 0x12;
  local_1b8.m_formatImpl = detail::FormatArg::formatImpl<int>;
  local_1b8.m_toIntImpl = detail::FormatArg::toIntImpl<int>;
  local_198 = detail::FormatArg::formatImpl<double>;
  local_190 = detail::FormatArg::toIntImpl<double>;
  local_180 = detail::FormatArg::formatImpl<double>;
  local_178 = detail::FormatArg::toIntImpl<double>;
  local_168 = detail::FormatArg::formatImpl<double>;
  local_160 = detail::FormatArg::toIntImpl<double>;
  local_158 = args_4;
  local_150 = detail::FormatArg::formatImpl<double>;
  local_148 = detail::FormatArg::toIntImpl<double>;
  local_140 = args_5;
  local_138 = detail::FormatArg::formatImpl<double>;
  local_130 = detail::FormatArg::toIntImpl<double>;
  local_128 = args_6;
  local_120 = detail::FormatArg::formatImpl<float>;
  local_118 = detail::FormatArg::toIntImpl<float>;
  local_110 = args_7;
  local_108 = detail::FormatArg::formatImpl<double>;
  local_100 = detail::FormatArg::toIntImpl<double>;
  local_f8 = args_8;
  local_f0 = detail::FormatArg::formatImpl<double>;
  local_e8 = detail::FormatArg::toIntImpl<double>;
  local_e0 = args_9;
  local_d8 = detail::FormatArg::formatImpl<double>;
  local_d0 = detail::FormatArg::toIntImpl<double>;
  local_c8 = args_10;
  local_c0 = detail::FormatArg::formatImpl<double>;
  local_b8 = detail::FormatArg::toIntImpl<double>;
  local_b0 = args_11;
  local_a8 = detail::FormatArg::formatImpl<double>;
  local_a0 = detail::FormatArg::toIntImpl<double>;
  local_98 = args_12;
  local_90 = detail::FormatArg::formatImpl<double>;
  local_88 = detail::FormatArg::toIntImpl<double>;
  local_80 = args_13;
  local_78 = detail::FormatArg::formatImpl<float>;
  local_70 = detail::FormatArg::toIntImpl<float>;
  local_68 = args_14;
  local_60 = detail::FormatArg::formatImpl<double>;
  local_58 = detail::FormatArg::toIntImpl<double>;
  local_50 = args_15;
  local_48 = detail::FormatArg::formatImpl<double>;
  local_40 = detail::FormatArg::toIntImpl<double>;
  local_38 = args_16;
  local_30 = detail::FormatArg::formatImpl<double>;
  local_28 = detail::FormatArg::toIntImpl<double>;
  local_20 = args_17;
  local_18 = detail::FormatArg::formatImpl<double>;
  local_10 = detail::FormatArg::toIntImpl<double>;
  local_1b8.m_value = args;
  local_1a0 = args_1;
  local_188 = args_2;
  local_170 = args_3;
  vformat(out,fmt,&local_1c8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void format(std::ostream& out, const char* fmt, const Args&... args)
{
    vformat(out, fmt, makeFormatList(args...));
}